

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_repeated_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::RepeatedMessageFieldGenerator::GenerateExtensionCode
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  string *psVar2;
  char *pcVar3;
  Options *pOVar4;
  Descriptor *pDVar5;
  WrapperFieldGenerator *this_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  string_view text;
  string_view text_00;
  
  pOVar4 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  WritePropertyDocComment(printer,pOVar4,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddDeprecatedFlag(&this->super_FieldGeneratorBase,printer);
  text._M_str = 
  "$access_level$ static readonly pb::RepeatedExtension<$extended_type$, $type_name$> $property_name$ =\n  new pb::RepeatedExtension<$extended_type$, $type_name$>($number$, "
  ;
  text._M_len = 0xa9;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_FieldGeneratorBase).variables_,text);
  pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
  if (pFVar1->type_ == '\v') {
    pDVar5 = FieldDescriptor::message_type(pFVar1);
    psVar2 = pDVar5->file_->name_;
    if (psVar2->_M_string_length == 0x1e) {
      pcVar3 = (psVar2->_M_dataplus)._M_p;
      auVar7[0] = -(pcVar3[0xe] == 'f');
      auVar7[1] = -(pcVar3[0xf] == '/');
      auVar7[2] = -(pcVar3[0x10] == 'w');
      auVar7[3] = -(pcVar3[0x11] == 'r');
      auVar7[4] = -(pcVar3[0x12] == 'a');
      auVar7[5] = -(pcVar3[0x13] == 'p');
      auVar7[6] = -(pcVar3[0x14] == 'p');
      auVar7[7] = -(pcVar3[0x15] == 'e');
      auVar7[8] = -(pcVar3[0x16] == 'r');
      auVar7[9] = -(pcVar3[0x17] == 's');
      auVar7[10] = -(pcVar3[0x18] == '.');
      auVar7[0xb] = -(pcVar3[0x19] == 'p');
      auVar7[0xc] = -(pcVar3[0x1a] == 'r');
      auVar7[0xd] = -(pcVar3[0x1b] == 'o');
      auVar7[0xe] = -(pcVar3[0x1c] == 't');
      auVar7[0xf] = -(pcVar3[0x1d] == 'o');
      auVar6[0] = -(*pcVar3 == 'g');
      auVar6[1] = -(pcVar3[1] == 'o');
      auVar6[2] = -(pcVar3[2] == 'o');
      auVar6[3] = -(pcVar3[3] == 'g');
      auVar6[4] = -(pcVar3[4] == 'l');
      auVar6[5] = -(pcVar3[5] == 'e');
      auVar6[6] = -(pcVar3[6] == '/');
      auVar6[7] = -(pcVar3[7] == 'p');
      auVar6[8] = -(pcVar3[8] == 'r');
      auVar6[9] = -(pcVar3[9] == 'o');
      auVar6[10] = -(pcVar3[10] == 't');
      auVar6[0xb] = -(pcVar3[0xb] == 'o');
      auVar6[0xc] = -(pcVar3[0xc] == 'b');
      auVar6[0xd] = -(pcVar3[0xd] == 'u');
      auVar6[0xe] = -(pcVar3[0xe] == 'f');
      auVar6[0xf] = -(pcVar3[0xf] == '/');
      auVar6 = auVar6 & auVar7;
      if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
        this_00 = (WrapperFieldGenerator *)operator_new(0x48);
        pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
        pOVar4 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
        WrapperFieldGenerator::WrapperFieldGenerator(this_00,pFVar1,-1,pOVar4);
        (*(this_00->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase[4]
        )(this_00,printer);
        goto LAB_0029c92a;
      }
    }
  }
  this_00 = (WrapperFieldGenerator *)operator_new(0x40);
  pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
  pOVar4 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  MessageFieldGenerator::MessageFieldGenerator((MessageFieldGenerator *)this_00,pFVar1,-1,pOVar4);
  (*(this_00->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase[4])
            (this_00,printer);
LAB_0029c92a:
  (*(this_00->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase[1])
            (this_00);
  text_00._M_str = ");\n";
  text_00._M_len = 3;
  io::Printer::Print<>(printer,text_00);
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::GenerateExtensionCode(io::Printer* printer) {
  WritePropertyDocComment(printer, options(), descriptor_);
  AddDeprecatedFlag(printer);
  printer->Print(
    variables_,
    "$access_level$ static readonly pb::RepeatedExtension<$extended_type$, $type_name$> $property_name$ =\n"
    "  new pb::RepeatedExtension<$extended_type$, $type_name$>($number$, ");
  if (IsWrapperType(descriptor_)) {
    std::unique_ptr<FieldGeneratorBase> single_generator(
      new WrapperFieldGenerator(descriptor_, -1, this->options()));
    single_generator->GenerateCodecCode(printer);
  } else {
    std::unique_ptr<FieldGeneratorBase> single_generator(
      new MessageFieldGenerator(descriptor_, -1, this->options()));
    single_generator->GenerateCodecCode(printer);
  }
  printer->Print(");\n");
}